

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

ostream * operator<<(ostream *os,ipv4_address *addr)

{
  char *pcVar1;
  in_addr_t local_1c;
  ipv4_address *piStack_18;
  in_addr tmp;
  ipv4_address *addr_local;
  ostream *os_local;
  
  piStack_18 = addr;
  memset(&local_1c,0,4);
  local_1c = piStack_18->addr_net;
  pcVar1 = inet_ntoa((in_addr)local_1c);
  std::operator<<(os,pcVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ipv4_address const& addr)
{
    in_addr tmp{};
    tmp.s_addr = addr.addr_net;
    os << inet_ntoa(tmp);
    return os;
}